

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O1

void __thiscall
menuwindow::menuwindow
          (menuwindow *this,Fl_Menu_Item *m,int X,int Y,int Wp,int Hp,Fl_Menu_Item *picked,
          Fl_Menu_Item *t,int menubar,int menubar_title,int right_edge)

{
  uint *puVar1;
  byte *pbVar2;
  byte bVar3;
  uchar *buf;
  Fl_Single_Window *pFVar4;
  Fl_Menu_ *m_00;
  Fl_Color FVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Fl_Menu_Item *m1;
  Fl_Menu_Item *this_00;
  Fl_Menu_Item *this_01;
  char *c;
  size_t sVar11;
  menutitle *this_02;
  byte bVar12;
  undefined4 in_register_0000000c;
  int iVar13;
  Fl_Boxtype t_00;
  undefined4 in_register_0000008c;
  int iVar14;
  int iVar15;
  double extraout_XMM0_Qa;
  double dVar16;
  int hh;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  int local_8c;
  ulong local_88;
  int local_7c;
  undefined8 local_78;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  Fl_Menu_Item *local_40;
  double local_38;
  
  local_60 = CONCAT44(in_register_0000008c,Hp);
  local_68 = CONCAT44(in_register_0000000c,Y);
  Fl_Menu_Window::Fl_Menu_Window(&this->super_Fl_Menu_Window,X,Y,Wp,Hp,(char *)0x0);
  (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.super_Fl_Widget
  ._vptr_Fl_Widget = (_func_int **)&PTR__menuwindow_002787b0;
  Fl::get_mouse((int *)&local_78,&local_8c);
  Fl::screen_work_area(&local_44,&local_48,&local_4c,&local_50,(int)local_78,local_8c);
  Fl_Group::end((Fl_Group *)this);
  puVar1 = &(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
            super_Fl_Widget.flags_;
  *puVar1 = *puVar1 | 0x5008;
  this->menu = m;
  if (m == (Fl_Menu_Item *)0x0) {
    this_00 = (Fl_Menu_Item *)0x0;
  }
  else {
    this_00 = Fl_Menu_Item::next(m,0);
  }
  this->drawn_selected = -1;
  m_00 = button;
  if (button == (Fl_Menu_ *)0x0) {
    (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget.box_ = '\x02';
  }
  else {
    bVar3 = (button->super_Fl_Widget).box_;
    bVar12 = 2;
    if (2 < bVar3) {
      bVar12 = bVar3;
    }
    (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
    super_Fl_Widget.box_ = bVar12;
  }
  FVar5 = 0x31;
  if ((m_00 != (Fl_Menu_ *)0x0) && (Fl::scheme_ == (char *)0x0)) {
    FVar5 = (m_00->super_Fl_Widget).color_;
  }
  (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.super_Fl_Widget
  .color_ = FVar5;
  this->selected = -1;
  local_6c = Wp;
  if (this_00 == (Fl_Menu_Item *)0x0) {
    iVar14 = 0;
LAB_001be02e:
    this->numitems = iVar14;
    if (menubar == 0) {
      this->itemheight = 1;
      local_8c = 0;
      local_7c = 0;
      if (t != (Fl_Menu_Item *)0x0) {
        local_7c = Fl_Menu_Item::measure(t,&local_8c,m_00);
        local_7c = local_7c + 0xc;
      }
      local_88 = 0;
      local_70 = X;
      local_40 = this_00;
      if (this_00 == (Fl_Menu_Item *)0x0) {
        iVar14 = 0;
        uVar10 = 0;
      }
      else {
        iVar14 = 0;
        uVar10 = 0;
        if (this_00->text != (char *)0x0) {
          uVar10 = 0;
          iVar14 = 0;
          local_88 = 0;
          do {
            iVar6 = Fl_Menu_Item::measure(this_00,&local_54,button);
            if (this->itemheight < local_54 + 4) {
              this->itemheight = local_54 + 4;
            }
            iVar7 = 0;
            if ((this_00->flags & 0x60) != 0) {
              iVar7 = FL_NORMAL_SIZE;
            }
            if ((int)uVar10 < iVar7 + iVar6) {
              uVar10 = iVar7 + iVar6;
            }
            iVar6 = iVar14;
            if (this_00->shortcut_ != 0) {
              c = fl_shortcut_label(this_00->shortcut_,(char **)&local_78);
              buf = (uchar *)CONCAT44(local_78._4_4_,(int)local_78);
              sVar11 = strlen((char *)buf);
              iVar6 = fl_utf_nb_char(buf,(int)sVar11);
              if (iVar6 < 5) {
                (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x37])
                          (fl_graphics_driver,c,(ulong)(uint)((int)local_78 - (int)c));
                local_38 = extraout_XMM0_Qa;
                dVar16 = fl_width((char *)CONCAT44(local_78._4_4_,(int)local_78));
                if (iVar14 <= (int)local_38) {
                  iVar14 = (int)local_38;
                }
                iVar7 = (int)local_88;
                local_88 = local_88 & 0xffffffff;
                iVar6 = iVar14;
                if (iVar7 < (int)((int)dVar16 + 4U)) {
                  local_88 = (ulong)((int)dVar16 + 4U);
                }
              }
              else {
                dVar16 = fl_width(c);
                iVar6 = ((int)dVar16 + 4) - (int)local_88;
                if ((int)dVar16 + 4 <= iVar14 + (int)local_88) {
                  iVar6 = iVar14;
                }
              }
            }
            iVar14 = iVar6;
            if (((this_00->labelcolor_ != 0) || (Fl::scheme_ != (char *)0x0)) ||
               (1 < this_00->labeltype_)) {
              pbVar2 = (byte *)((long)&(this->super_Fl_Menu_Window).super_Fl_Single_Window.
                                       super_Fl_Window.super_Fl_Group.super_Fl_Widget.flags_ + 1);
              *pbVar2 = *pbVar2 | 0x80;
            }
            this_00 = Fl_Menu_Item::next(this_00,1);
          } while (this_00->text != (char *)0x0);
        }
      }
      iVar13 = (int)local_88;
      this->shortcutWidth = iVar13;
      iVar6 = this->selected;
      iVar7 = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                               super_Fl_Group.super_Fl_Widget.box_);
      uVar8 = uVar10 >> 1;
      if (local_6c != 0) {
        uVar8 = 0;
      }
      if (iVar6 < 0) {
        uVar8 = 0;
      }
      iVar14 = iVar13 + iVar14 + uVar10 + iVar7 * 2 + 7;
      if (iVar14 < local_6c) {
        iVar14 = local_6c;
      }
      if (iVar14 < local_7c) {
        iVar14 = local_7c;
      }
      iVar6 = local_70 - uVar8;
      if ((int)(local_70 - uVar8) <= local_44) {
        iVar6 = local_44;
      }
      iVar13 = (local_44 - iVar14) + local_4c;
      if (iVar6 < iVar13) {
        iVar13 = iVar6;
      }
      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.x_ = iVar13;
      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.w_ = iVar14;
      iVar14 = this->itemheight;
      iVar6 = iVar14 * this->numitems + -4;
      if (this->numitems == 0) {
        iVar6 = 0;
      }
      iVar6 = iVar6 + iVar7 * 2 + 3;
      (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
      super_Fl_Widget.h_ = iVar6;
      if (this->selected < 0) {
        iVar15 = (int)local_60 + (int)local_68;
        if (local_50 + local_48 < iVar15 + iVar6) {
          local_88 = CONCAT44(local_88._4_4_,iVar15 - iVar6);
          if (local_48 <= iVar15 - iVar6) {
            if ((int)local_60 < 2) {
              t_00 = (Fl_Boxtype)
                     (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                     super_Fl_Group.super_Fl_Widget.box_;
              if (t == (Fl_Menu_Item *)0x0) {
                iVar15 = Fl::box_dy(t_00);
                iVar15 = (int)local_88 + iVar14 + iVar15;
              }
              else {
                iVar9 = Fl::box_dh(t_00);
                iVar15 = iVar15 - (iVar14 + iVar6 + iVar9);
              }
            }
            else {
              iVar15 = (int)local_68 - iVar6;
            }
          }
        }
      }
      else {
        iVar15 = (((int)local_60 - iVar14) / 2 + (int)local_68) - (this->selected * iVar14 + iVar7);
      }
      iVar6 = local_70;
      iVar14 = local_8c;
      if (local_40 == (Fl_Menu_Item *)0x0) {
        (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
        super_Fl_Widget.y_ = iVar15 + -2;
        pFVar4 = &(this->super_Fl_Menu_Window).super_Fl_Single_Window;
        (pFVar4->super_Fl_Window).super_Fl_Group.super_Fl_Widget.w_ = 1;
        (pFVar4->super_Fl_Window).super_Fl_Group.super_Fl_Widget.h_ = 1;
      }
      else {
        (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
        super_Fl_Widget.y_ = iVar15;
      }
      if (t == (Fl_Menu_Item *)0x0) {
        this_02 = (menutitle *)0x0;
      }
      else if (menubar_title == 0) {
        this_02 = (menutitle *)operator_new(0xf8);
        iVar14 = iVar7 * 2 + iVar14 + 3;
        menutitle::menutitle(this_02,iVar13,(iVar15 - iVar14) + -2,local_7c,iVar14,t);
      }
      else {
        uVar10 = Fl::box_dy((uint)(button->super_Fl_Widget).box_);
        iVar14 = (button->super_Fl_Widget).h_;
        this_02 = (menutitle *)operator_new(0xf8);
        iVar14 = iVar14 + uVar10 * -2 + -2;
        menutitle::menutitle(this_02,iVar6,(~uVar10 + (int)local_68) - iVar14,local_7c,iVar14,t);
      }
      this->title = this_02;
    }
    else {
      this->itemheight = 0;
      this->title = (menutitle *)0x0;
    }
    return;
  }
  iVar14 = 0;
  this_01 = this_00;
  do {
    if (picked == (Fl_Menu_Item *)0x0) {
LAB_001be004:
      picked = (Fl_Menu_Item *)0x0;
    }
    else {
      iVar6 = iVar14;
      if (this_01 == picked) {
LAB_001bdffe:
        this->selected = iVar6;
        goto LAB_001be004;
      }
      if (picked < this_01) {
        local_60 = 0;
        local_6c = 0;
        iVar6 = iVar14 + -1;
        goto LAB_001bdffe;
      }
    }
    if (this_01->text == (char *)0x0) goto LAB_001be02e;
    this_01 = Fl_Menu_Item::next(this_01,1);
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

menuwindow::menuwindow(const Fl_Menu_Item* m, int X, int Y, int Wp, int Hp,
		       const Fl_Menu_Item* picked, const Fl_Menu_Item* t, 
		       int menubar, int menubar_title, int right_edge)
  : Fl_Menu_Window(X, Y, Wp, Hp, 0)
{
  int scr_x, scr_y, scr_w, scr_h;
  int tx = X, ty = Y;

  Fl::screen_work_area(scr_x, scr_y, scr_w, scr_h);
  if (!right_edge || right_edge > scr_x+scr_w) right_edge = scr_x+scr_w;

  end();
  set_modal();
  clear_border();
  set_menu_window();
  menu = m;
  if (m) m = m->first(); // find the first item that needs to be rendered
  drawn_selected = -1;
  if (button) {
    box(button->box());
    if (box() == FL_NO_BOX || box() == FL_FLAT_BOX) box(FL_UP_BOX);
  } else {
    box(FL_UP_BOX);
  }
  color(button && !Fl::scheme() ? button->color() : FL_GRAY);
  selected = -1;
  {
    int j = 0;
    if (m) for (const Fl_Menu_Item* m1=m; ; m1 = m1->next(), j++) {
      if (picked) {
        if (m1 == picked) {selected = j; picked = 0;}
        else if (m1 > picked) {selected = j-1; picked = 0; Wp = Hp = 0;}
    }
    if (!m1->text) break;
  }
  numitems = j;}

  if (menubar) {
    itemheight = 0;
    title = 0;
    return;
  }

  itemheight = 1;

  int hotKeysw = 0;
  int hotModsw = 0;
  int Wtitle = 0;
  int Htitle = 0;
  if (t) Wtitle = t->measure(&Htitle, button) + 12;
  int W = 0;
  if (m) for (; m->text; m = m->next()) {
    int hh; 
    int w1 = m->measure(&hh, button);
    if (hh+LEADING>itemheight) itemheight = hh+LEADING;
    if (m->flags&(FL_SUBMENU|FL_SUBMENU_POINTER)) 
      w1 += FL_NORMAL_SIZE;
    if (w1 > W) W = w1;
    // calculate the maximum width of all shortcuts
    if (m->shortcut_) {
      // s is a pointer to the UTF-8 string for the entire shortcut
      // k points only to the key part (minus the modifier keys)
      const char *k, *s = fl_shortcut_label(m->shortcut_, &k);
      if (fl_utf_nb_char((const unsigned char*)k, (int) strlen(k))<=4) {
        // a regular shortcut has a right-justified modifier followed by a left-justified key
        w1 = int(fl_width(s, (int) (k-s)));
        if (w1 > hotModsw) hotModsw = w1;
        w1 = int(fl_width(k))+4;
        if (w1 > hotKeysw) hotKeysw = w1;
      } else {
        // a shortcut with a long modifier is right-justified to the menu
        w1 = int(fl_width(s))+4;
        if (w1 > (hotModsw+hotKeysw)) {
          hotModsw = w1-hotKeysw;
        }
      }
    }
    if (m->labelcolor_ || Fl::scheme() || m->labeltype_ > FL_NO_LABEL) clear_overlay();
  }
  shortcutWidth = hotKeysw;
  if (selected >= 0 && !Wp) X -= W/2;
  int BW = Fl::box_dx(box());
  W += hotKeysw+hotModsw+2*BW+7;
  if (Wp > W) W = Wp;
  if (Wtitle > W) W = Wtitle;

  if (X < scr_x) X = scr_x; 
  // this change improves popup submenu positioning at right screen edge, 
  // but it makes right_edge argument useless
  //if (X > scr_x+scr_w-W) X = right_edge-W;
  if (X > scr_x+scr_w-W) X = scr_x+scr_w-W;
  x(X); w(W);
  h((numitems ? itemheight*numitems-LEADING : 0)+2*BW+3);
  if (selected >= 0) {
    Y = Y+(Hp-itemheight)/2-selected*itemheight-BW;
  } else {
    Y = Y+Hp;
    // if the menu hits the bottom of the screen, we try to draw
    // it above the menubar instead. We will not adjust any menu
    // that has a selected item.
    if (Y+h()>scr_y+scr_h && Y-h()>=scr_y) {
      if (Hp>1) {
        // if we know the height of the Fl_Menu_, use it
        Y = Y-Hp-h();
      } else if (t) {
        // assume that the menubar item height relates to the first
        // menuitem as well
        Y = Y-itemheight-h()-Fl::box_dh(box());
      } else {
        // draw the menu to the right
        Y = Y-h()+itemheight+Fl::box_dy(box());
      }
    }
  }
  if (m) y(Y); else {y(Y-2); w(1); h(1);}

  if (t) {
    if (menubar_title) {
      int dy = Fl::box_dy(button->box())+1;
      int ht = button->h()-dy*2;
      title = new menutitle(tx, ty-ht-dy, Wtitle, ht, t);
    } else {
      int dy = 2;
      int ht = Htitle+2*BW+3;
      title = new menutitle(X, Y-ht-dy, Wtitle, ht, t);
    }
  } else {
    title = 0;
  }
}